

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O0

double mpack_load_double(char *p)

{
  double dVar1;
  anon_union_8_2_94730072 v;
  char *p_local;
  
  dVar1 = (double)mpack_load_u64(p);
  return dVar1;
}

Assistant:

MPACK_INLINE double mpack_load_double(const char* p) {
    MPACK_CHECK_FLOAT_ORDER();
    union {
        double d;
        uint64_t u;
    } v;
    v.u = mpack_load_u64(p);
    return v.d;
}